

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

void __thiscall
IF97::Backwards::BackwardsRegion::BackwardsRegion
          (BackwardsRegion *this,BackwardRegionResidualElement *data,size_t N)

{
  ulong local_28;
  size_t i;
  size_t N_local;
  BackwardRegionResidualElement *data_local;
  BackwardsRegion *this_local;
  
  this->_vptr_BackwardsRegion = (_func_int **)&PTR_T_pX_001376c0;
  std::vector<double,_std::allocator<double>_>::vector(&this->I);
  std::vector<double,_std::allocator<double>_>::vector(&this->J);
  std::vector<double,_std::allocator<double>_>::vector(&this->n);
  this->N = N;
  for (local_28 = 0; local_28 < N; local_28 = local_28 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back(&this->n,&data[local_28].n);
    std::vector<double,_std::allocator<double>_>::push_back(&this->I,&data[local_28].I);
    std::vector<double,_std::allocator<double>_>::push_back(&this->J,&data[local_28].J);
  }
  return;
}

Assistant:

BackwardsRegion(BackwardRegionResidualElement data[], std::size_t N){
                this->N = N;
                for (std::size_t i = 0; i < N; ++i){
                    n.push_back(data[i].n);
                    I.push_back(data[i].I);
                    J.push_back(data[i].J);
                }
            }